

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

void FIX::string_replace(string *oldValue,string *newValue,string *value)

{
  ulong uVar1;
  
  for (uVar1 = std::__cxx11::string::find((char *)value,(ulong)(oldValue->_M_dataplus)._M_p,0);
      uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find
                        ((char *)value,(ulong)(oldValue->_M_dataplus)._M_p,
                         uVar1 + newValue->_M_string_length)) {
    std::__cxx11::string::replace
              ((ulong)value,uVar1,(char *)oldValue->_M_string_length,
               (ulong)(newValue->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

void string_replace( const std::string& oldValue,
                     const std::string& newValue,
                     std::string& value )
{
  for( std::string::size_type pos = value.find(oldValue);
       pos != std::string::npos;
       pos = value.find(oldValue, pos) )
  {
    value.replace( pos, oldValue.size(), newValue );
    pos += newValue.size();
  }
}